

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puthread-posix.c
# Opt level: O3

void p_uthread_set_name_internal(PUThread *thread)

{
  pchar *ppVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *__format;
  
  pcVar5 = (thread->base).name;
  sVar4 = strlen(pcVar5);
  if (sVar4 < 0x10) {
    iVar3 = pthread_setname_np(thread->hdl,pcVar5);
  }
  else {
    pcVar5 = (char *)p_malloc0(sVar4 + 1);
    if (pcVar5 == (char *)0x0) {
      __format = "** Error: %s **\n";
      pcVar5 = "PUThread::p_uthread_set_name_internal: failed to allocate memory";
      goto LAB_00116869;
    }
    ppVar1 = (thread->base).name;
    uVar2 = *(undefined8 *)ppVar1;
    *(undefined8 *)(pcVar5 + 7) = *(undefined8 *)(ppVar1 + 7);
    *(undefined8 *)pcVar5 = uVar2;
    iVar3 = pthread_setname_np(thread->hdl,pcVar5);
    p_free(pcVar5);
  }
  if (iVar3 == 0) {
    return;
  }
  __format = "** Warning: %s **\n";
  pcVar5 = "PUThread::p_uthread_set_name_internal: failed to set thread system name";
LAB_00116869:
  printf(__format,pcVar5);
  return;
}

Assistant:

void
p_uthread_set_name_internal (PUThread *thread)
{
	pchar    *thr_name = NULL;
	pint     res       = 0;
	pboolean is_alloc  = FALSE;
#ifdef PUTHREAD_MAX_NAME
	psize    namelen   = 0;
#endif

	thr_name = thread->base.name;

#ifdef PUTHREAD_MAX_NAME
	namelen  = strlen (thr_name);

	if (namelen > PUTHREAD_MAX_NAME - 1) {
		if (P_UNLIKELY ((thr_name = p_malloc0 (namelen + 1)) == NULL)) {
			P_ERROR ("PUThread::p_uthread_set_name_internal: failed to allocate memory");
			return;
		}

		memcpy (thr_name, thread->base.name, PUTHREAD_MAX_NAME - 1);

		is_alloc = TRUE;
	}
#endif

#if defined(PLIBSYS_HAS_PTHREAD_SETNAME)
#  if defined(P_OS_MAC)
	if (thread->hdl != pthread_self ())
		P_WARNING ("PUThread::p_uthread_set_name_internal: only calling thread is supported in macOS");
	else
		res = pthread_setname_np (thr_name);
#  elif defined(P_OS_NETBSD)
	res = pthread_setname_np (thread->hdl, "%s", thr_name);
#  elif defined(P_OS_TRU64) || defined(P_OS_VMS)
	res = pthread_setname_np (thread->hdl, thr_name, 0);
#  else
	res = pthread_setname_np (thread->hdl, thr_name);
#  endif
#elif defined(PLIBSYS_HAS_PTHREAD_SET_NAME)
	pthread_set_name_np (thread->hdl, thr_name);
#elif defined(PLIBSYS_HAS_PTHREAD_PRCTL)
	if (thread->hdl != pthread_self ())
		P_WARNING ("PUThread::p_uthread_set_name_internal: prctl() can be used on calling thread only");
	else
		res = prctl (PR_SET_NAME, thr_name, NULL, NULL, NULL);
#elif defined(P_OS_HAIKU)
	res = rename_thread (find_thread (NULL), thr_name);
#endif

	if (is_alloc == TRUE)
		p_free (thr_name);

	if (res != 0)
		P_WARNING ("PUThread::p_uthread_set_name_internal: failed to set thread system name");
}